

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partitioned_tuple_data.cpp
# Opt level: O2

void __thiscall duckdb::PartitionedTupleData::Verify(PartitionedTupleData *this)

{
  return;
}

Assistant:

void PartitionedTupleData::Verify() const {
#ifdef DEBUG
	idx_t total_count = 0;
	idx_t total_size = 0;
	for (auto &partition : partitions) {
		partition->Verify();
		total_count += partition->Count();
		total_size += partition->SizeInBytes();
	}
	D_ASSERT(total_count == this->count);
	D_ASSERT(total_size == this->data_size);
#endif
}